

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O2

int readFASTA(FILE *F,char *automatonState,StringBuffer *names,StringBuffer *sequences,
             Vector *nameLengths,Vector *seqLengths,long *firstSequenceLength,bool oneByOne,
             Vector *sequenceInstances,char sep,double include_prob,bool progress)

{
  char cVar1;
  bool bVar2;
  StringBuffer *this;
  Vector *lengths;
  uint __c;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  unsigned_long uVar6;
  long lVar7;
  string *psVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  allocator local_171;
  Vector *local_170;
  ulong local_168;
  Vector *local_160;
  double local_158;
  time_t after;
  time_t before;
  double local_140;
  string err;
  
  local_160 = seqLengths;
  if (oneByOne) {
    StringBuffer::resetString(sequences);
    StringBuffer::resetString(names);
    include_prob = 1.0;
  }
  uVar4 = (ulong)(include_prob * 4294967295.0);
  uVar10 = 0;
  if (include_prob < 1.0) {
    uVar10 = (long)(include_prob * 4294967295.0 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f |
             uVar4;
  }
  local_170 = nameLengths;
  local_158 = include_prob;
  if (progress) {
    time(&before);
  }
  bVar2 = local_158 < 1.0;
  flockfile((FILE *)F);
  bVar11 = true;
  local_168 = 0;
LAB_001051e2:
  do {
    while( true ) {
      __c = getc_unlocked((FILE *)F);
      iVar3 = feof_unlocked((FILE *)F);
      cVar1 = *automatonState;
      if (iVar3 != 0) {
        if (cVar1 != '\x02' && (!oneByOne || cVar1 != '\0')) {
          snprintf((char *)&err,0xff,"Unexpected end of file: state %d",(ulong)(uint)(int)cVar1);
          psVar8 = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string(psVar8,(char *)&err,&local_171);
          __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        if (bVar11) {
          if (oneByOne) {
            if (*firstSequenceLength == 0) {
              *firstSequenceLength = sequences->sLength - 1;
            }
            *automatonState = '\0';
            StringBuffer::appendChar(sequences,'\0');
            funlockfile((FILE *)F);
            return 3;
          }
          addASequenceToList(sequences,local_160,firstSequenceLength,names,local_170);
        }
        *automatonState = '\x01';
        return 0;
      }
      if (cVar1 != '\x02') break;
      iVar3 = toupper(__c);
      __c = (uint)(byte)validFlags[iVar3];
      this = sequences;
      if (-1 < validFlags[iVar3]) goto joined_r0x0010528b;
      if ((iVar3 == 0x3e) || (iVar3 == 0x23)) {
        *automatonState = '\x01';
        if (bVar11) {
          if (oneByOne) {
            if (*firstSequenceLength == 0) {
              *firstSequenceLength = sequences->sLength - 1;
            }
            *automatonState = '\0';
            StringBuffer::appendChar(sequences,'\0');
            ungetc(iVar3,(FILE *)F);
            funlockfile((FILE *)F);
            return 2;
          }
          addASequenceToList(sequences,local_160,firstSequenceLength,names,local_170);
          local_168 = local_168 + 1;
          if ((local_168 & 0x3ff) == 0 && progress) {
            time(&after);
            poVar5 = std::operator<<((ostream *)&std::cerr,
                                     "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                                    );
            *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 8;
            poVar5 = std::ostream::_M_insert<long>((long)poVar5);
            poVar5 = std::operator<<(poVar5," sequences read (");
            lVar7 = *(long *)poVar5;
            *(undefined8 *)(poVar5 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
            *(undefined8 *)(poVar5 + *(long *)(lVar7 + -0x18) + 8) = 3;
            local_140 = (double)(long)local_168;
            dVar13 = difftime(after,before);
            poVar5 = std::ostream::_M_insert<double>(local_140 / dVar13);
            std::operator<<(poVar5," seqs/sec)");
            after = before;
          }
        }
        bVar11 = true;
LAB_001053bd:
        if (sequenceInstances == (Vector *)0x0 && bVar2) {
          uVar6 = genrand_int32();
          bVar11 = uVar6 < uVar10;
        }
      }
    }
    if (cVar1 == '\x01') {
      if ((__c == 0xd) || (this = names, __c == 10)) {
        if (bVar11) {
          StringBuffer::appendChar(names,'\0');
          lengths = local_170;
          if (oneByOne) {
            uVar4 = names->sLength - 1;
          }
          else {
            Vector::appendValue(local_170,names->sLength);
            uVar4 = stringLength(lengths,lengths->vLength - 2);
          }
          if ((long)uVar4 < 1) {
            psVar8 = (string *)__cxa_allocate_exception(0x20);
            std::__cxx11::string::string
                      (psVar8,"Sequence names must be non-empty.",(allocator *)&err);
            __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          *automatonState = '\x02';
          if (sequenceInstances != (Vector *)0x0) {
            lVar7 = 1;
            if (2 < uVar4) {
              for (lVar7 = 0; 2 - uVar4 != lVar7; lVar7 = lVar7 + -1) {
                if (names->sData[lVar7 + (names->sLength - 3)] == sep) {
                  iVar3 = atoi(names->sData + lVar7 + names->sLength + -2);
                  lVar7 = (long)iVar3;
                  goto LAB_0010548e;
                }
              }
              lVar7 = 1;
LAB_0010548e:
              lVar7 = lVar7 + (ulong)(lVar7 == 0);
              if (local_158 < 1.0) {
                lVar9 = 0;
                while (bVar12 = lVar7 != 0, lVar7 = lVar7 + -1, bVar12) {
                  uVar6 = genrand_int32();
                  lVar9 = lVar9 + (ulong)(uVar6 < uVar10);
                }
                lVar7 = lVar9;
                if (lVar9 == 0) {
                  if (oneByOne) {
                    StringBuffer::resetString(names);
                  }
                  else {
                    uVar4 = Vector::value(local_170,local_170->vLength - 2);
                    if (uVar4 < names->sLength) {
                      names->sLength = uVar4;
                    }
                  }
                  bVar11 = false;
                  Vector::remove(local_170,(char *)(local_170->vLength - 1));
                  goto LAB_001051e2;
                }
              }
            }
            if (oneByOne) {
              Vector::resetVector(sequenceInstances);
            }
            Vector::appendValue(sequenceInstances,lVar7);
          }
        }
      }
      else {
joined_r0x0010528b:
        if (bVar11) {
          StringBuffer::appendChar(this,(char)__c);
        }
      }
      goto LAB_001051e2;
    }
    if ((cVar1 == '\0') && ((__c == 0x3e || (__c == 0x23)))) {
      *automatonState = '\x01';
      goto LAB_001053bd;
    }
  } while( true );
}

Assistant:

int readFASTA (FILE* F, char& automatonState,  StringBuffer &names, 
               StringBuffer& sequences, Vector &nameLengths, Vector &seqLengths, 
               long& firstSequenceLength, bool oneByOne, 
               Vector* sequenceInstances, char sep,
               double include_prob, bool progress) {
  
  unsigned long up_to = 0L;
  
  if (oneByOne) {
    sequences.resetString();
    names.resetString();
    include_prob = 1.;
  }
  
  if (include_prob < 1.) {
    up_to = RAND_RANGE * include_prob;
  }
    
  time_t before, after;
  if (progress) {
    time(&before);
  }

  
  bool include_me = true;
  long read_counter = 0;
    
  flockfile(F);
    
  try {
  
      while (1) {
        int currentC = getc_unlocked (F);
          //cout << "State: " << int(automatonState) << "/'" << char(currentC) << "'" << endl;
        if (feof_unlocked (F))
          break;
          
        switch (automatonState) {
          case 0: {
            if (currentC == '>' || currentC == '#') {
              automatonState = 1;
              if (sequenceInstances == NULL && include_prob < 1.) {
                include_me = genrand_int32() < up_to;
              }
            }
            break;
          }
          case 1: {
            if (currentC == '\n' || currentC == '\r') {
              if (include_me) {
                  names.appendChar   ('\0');
     
                long this_name_l;
                if (oneByOne) {
                  this_name_l = names.length ()-1;
                  
                } else {
                  nameLengths.appendValue (names.length());
                  this_name_l = stringLength (nameLengths, nameLengths.length()-2);
                }

                
                if (this_name_l <= 0) {
                  throw std::string("Sequence names must be non-empty.");
                }
                automatonState = 2;

                if (sequenceInstances) {
                    unsigned long count = 1L;
                   if (this_name_l >= 3) {
                      long sep_loc = 0, ll = names.length();
                      for (sep_loc = 2; sep_loc < this_name_l; sep_loc ++) {
                        if (names.getChar(ll-sep_loc-1) == sep) {
                          break;
                        }
                      }
                      if (sep_loc < this_name_l) {
                        count = atoi (names.getString() + (ll-sep_loc));
                      }
                      if (count < 1) {
                        count = 1;
                      }
                      
                      unsigned long resampled_prob = 0UL;
                      
                      if (include_prob < 1.) {
                        for (long k = 0; k < count; k ++) {
                          resampled_prob += genrand_int32() < up_to;
                        }
                      } else {
                        resampled_prob = count;
                      }
                     
                     //cerr << count << " -> " << resampled_prob << endl;
                     
                      if (resampled_prob == 0UL) {
                        if (oneByOne) {
                          names.resetString();
                        } else {
                          names.reset_length (nameLengths.value (nameLengths.length()-2));
                        }
                        nameLengths.remove(nameLengths.length()-1);
                        include_me = false;
                        continue;
                      } else {
                        count = resampled_prob;
                      }
                      
                    }
                    if (oneByOne) {
                      sequenceInstances->resetVector();
                    }
                    sequenceInstances->appendValue(count);
                  }
               }
              
                
            }
            else {
              if (include_me) {
                names.appendChar(currentC);
              }
            }
            break;
          }
          case 2: {
            currentC = toupper (currentC);
            if (validFlags [currentC] >= 0) {
              if (include_me)
                //cout << "Append " << currentC << endl;
                sequences.appendChar (validFlags [currentC]);
            }
            else {
              if (currentC == '>' || currentC == '#') {
                automatonState = 1;
                if (include_me) {
                  if (oneByOne) {
                    if (firstSequenceLength == 0) {
                      firstSequenceLength = sequences.length()-1;
                    }
                      //cerr << endl << "Returning a sequence" << endl;
                    automatonState = 0;
                    sequences.appendChar ('\0');
                    ungetc (currentC, F);
                    funlockfile (F);
                    return 2;
                  }
                  addASequenceToList (sequences, seqLengths, firstSequenceLength, names, nameLengths);
                  read_counter++;
                  if (progress && read_counter % 1024 == 0) {
                      time(&after);
                      cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                              "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                              "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                              ":"
                           << setw(8) << read_counter << " sequences read (" << setw(12) << std::setprecision(3)
                           << read_counter / difftime(after, before) << " seqs/sec)";

                      after = before;
                  }
                }
                if (sequenceInstances == NULL && include_prob < 1.) {
                  include_me = genrand_int32() < up_to;
                } else {
                  include_me = true;
                }
                  
              }
            }
            break;
          }
        }
      }
      
      if (automatonState == 2 || (oneByOne && automatonState == 0)) {
          if (include_me) {
              if (oneByOne) {
                  if (firstSequenceLength == 0) {
                      firstSequenceLength = sequences.length()-1;
                  }
                  automatonState = 0;
                  sequences.appendChar ('\0');
                  funlockfile (F);
                  return 3;
              } else {
                  addASequenceToList (sequences, seqLengths, firstSequenceLength, names, nameLengths);
              }
          }
          automatonState = 1;
      } else {
        char err[256] ;
        snprintf (err, 255, "Unexpected end of file: state %d", automatonState);
        throw std::string(err);
      }
  } catch (std::string const err) {
      cerr << err << endl;
      funlockfile (F);
      return 1;
  }
  return 0;
}